

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_cursor.c
# Opt level: O2

TSNode * ts_tree_cursor_current_node(TSNode *__return_storage_ptr__,TSTreeCursor *_self)

{
  ushort uVar1;
  uint32_t uVar2;
  TSSymbol *pTVar3;
  void *pvVar4;
  undefined8 uVar5;
  _Bool _Var6;
  uint uVar7;
  ulong uVar8;
  undefined8 *puVar9;
  TSTree *pTVar10;
  
  uVar2 = _self->context[0];
  if (uVar2 != 0) {
    puVar9 = (undefined8 *)((ulong)(uVar2 - 1) * 0x20 + (long)_self->id);
    if (uVar2 == 1) {
      pTVar10 = (TSTree *)_self->tree;
      uVar7 = 0;
    }
    else {
      uVar8 = (ulong)*(ushort *)(**(long **)((long)_self->id + (ulong)(uVar2 - 2) * 0x20) + 0x4c);
      pTVar10 = (TSTree *)_self->tree;
      uVar7 = 0;
      if (uVar8 != 0) {
        pTVar3 = pTVar10->language->alias_sequences;
        uVar7 = 0;
        if (pTVar3 != (TSSymbol *)0x0) {
          uVar1 = pTVar10->language->max_alias_sequence_length;
          _Var6 = ts_subtree_extra(*(Subtree *)*puVar9);
          if (!_Var6) {
            uVar7 = (uint)pTVar3[uVar1 * uVar8 + (ulong)*(uint *)(puVar9 + 3)];
          }
        }
      }
    }
    pvVar4 = (void *)*puVar9;
    uVar5 = puVar9[1];
    uVar2 = *(uint32_t *)(puVar9 + 2);
    __return_storage_ptr__->context[0] = (uint32_t)uVar5;
    __return_storage_ptr__->context[1] = (uint32_t)((ulong)uVar5 >> 0x20);
    __return_storage_ptr__->context[2] = uVar2;
    __return_storage_ptr__->context[3] = uVar7;
    __return_storage_ptr__->id = pvVar4;
    __return_storage_ptr__->tree = pTVar10;
    return __return_storage_ptr__;
  }
  __assert_fail("(uint32_t)(&self->stack)->size - 1 < (&self->stack)->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/tree_cursor.c"
                ,0xe3,"TSNode ts_tree_cursor_current_node(const TSTreeCursor *)");
}

Assistant:

TSNode ts_tree_cursor_current_node(const TSTreeCursor *_self) {
  const TreeCursor *self = (const TreeCursor *)_self;
  TreeCursorEntry *last_entry = array_back(&self->stack);
  TSSymbol alias_symbol = 0;
  if (self->stack.size > 1) {
    TreeCursorEntry *parent_entry = &self->stack.contents[self->stack.size - 2];
    const TSSymbol *alias_sequence = ts_language_alias_sequence(
      self->tree->language,
      parent_entry->subtree->ptr->alias_sequence_id
    );
    if (alias_sequence && !ts_subtree_extra(*last_entry->subtree)) {
      alias_symbol = alias_sequence[last_entry->structural_child_index];
    }
  }
  return ts_node_new(
    self->tree,
    last_entry->subtree,
    last_entry->position,
    alias_symbol
  );
}